

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode NodeId_decodeBinary(UA_NodeId *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  UA_Byte UVar2;
  ulong uVar3;
  UA_Byte *pUVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  UA_UInt16 UVar8;
  
  pUVar4 = end;
  pUVar1 = pos + 1;
  if (end < pUVar1) {
    return 0x80070000;
  }
  UVar2 = *pos;
  uVar3 = (ulong)pos >> 8;
  pos = pUVar1;
  switch(UVar2) {
  case '\0':
    dst->identifierType = UA_NODEIDTYPE_NUMERIC;
    if (pUVar4 < pos + 1) {
      uVar5 = 0x80070000;
      uVar6 = 0;
    }
    else {
      uVar6 = (uint)*pos;
      uVar5 = 0;
      pos = pos + 1;
    }
    (dst->identifier).numeric = uVar6;
    dst->namespaceIndex = 0;
    break;
  case '\x01':
    dst->identifierType = UA_NODEIDTYPE_NUMERIC;
    uVar5 = 0x80070000;
    uVar6 = 0;
    UVar8 = 0;
    uVar7 = 0x80070000;
    if (pos + 1 <= pUVar4) {
      UVar8 = (UA_UInt16)*pos;
      uVar7 = 0;
      pos = pos + 1;
    }
    dst->namespaceIndex = UVar8;
    if (pos + 2 <= pUVar4) {
      uVar6 = (uint)*(ushort *)pos;
      uVar5 = 0;
      pos = pos + 2;
    }
    uVar5 = uVar5 | uVar7;
    (dst->identifier).numeric = uVar6;
    break;
  case '\x02':
    dst->identifierType = UA_NODEIDTYPE_NUMERIC;
    uVar5 = 0x80070000;
    uVar6 = 0x80070000;
    if (pos + 2 <= pUVar4) {
      dst->namespaceIndex = *(UA_UInt16 *)pos;
      pos = pos + 2;
      uVar6 = 0;
    }
    if (pos + 4 <= end) {
      (dst->identifier).numeric = *(UA_UInt32 *)pos;
      uVar5 = 0;
      pos = pos + 4;
    }
    uVar5 = uVar5 | uVar6;
    break;
  case '\x03':
    dst->identifierType = UA_NODEIDTYPE_STRING;
    goto LAB_00112b1e;
  case '\x04':
    dst->identifierType = UA_NODEIDTYPE_GUID;
    uVar6 = 0x80070000;
    if (pos + 2 <= pUVar4) {
      dst->namespaceIndex = *(UA_UInt16 *)pos;
      pos = pos + 2;
      uVar6 = 0;
    }
    uVar5 = Guid_decodeBinary(&(dst->identifier).guid,(UA_DataType *)CONCAT71((int7)uVar3,UVar2));
    goto LAB_00112b57;
  case '\x05':
    dst->identifierType = UA_NODEIDTYPE_BYTESTRING;
LAB_00112b1e:
    uVar6 = 0x80070000;
    if (pos + 2 <= pUVar4) {
      dst->namespaceIndex = *(UA_UInt16 *)pos;
      pos = pos + 2;
      uVar6 = 0;
    }
    uVar5 = Array_decodeBinary(&(dst->identifier).string.data,(size_t *)&(dst->identifier).numeric,
                               UA_TYPES + 2);
LAB_00112b57:
    uVar5 = uVar5 | uVar6;
    break;
  default:
    uVar5 = 0x80020000;
  }
  return uVar5;
}

Assistant:

static UA_StatusCode
NodeId_decodeBinary(UA_NodeId *dst, const UA_DataType *_) {
    UA_Byte dstByte = 0, encodingByte = 0;
    UA_UInt16 dstUInt16 = 0;
    UA_StatusCode retval = Byte_decodeBinary(&encodingByte, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    switch (encodingByte) {
    case UA_NODEIDTYPE_NUMERIC_TWOBYTE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval = Byte_decodeBinary(&dstByte, NULL);
        dst->identifier.numeric = dstByte;
        dst->namespaceIndex = 0;
        break;
    case UA_NODEIDTYPE_NUMERIC_FOURBYTE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval |= Byte_decodeBinary(&dstByte, NULL);
        dst->namespaceIndex = dstByte;
        retval |= UInt16_decodeBinary(&dstUInt16, NULL);
        dst->identifier.numeric = dstUInt16;
        break;
    case UA_NODEIDTYPE_NUMERIC_COMPLETE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= UInt32_decodeBinary(&dst->identifier.numeric, NULL);
        break;
    case UA_NODEIDTYPE_STRING:
        dst->identifierType = UA_NODEIDTYPE_STRING;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= String_decodeBinary(&dst->identifier.string, NULL);
        break;
    case UA_NODEIDTYPE_GUID:
        dst->identifierType = UA_NODEIDTYPE_GUID;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= Guid_decodeBinary(&dst->identifier.guid, NULL);
        break;
    case UA_NODEIDTYPE_BYTESTRING:
        dst->identifierType = UA_NODEIDTYPE_BYTESTRING;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= ByteString_decodeBinary(&dst->identifier.byteString);
        break;
    default:
        retval |= UA_STATUSCODE_BADINTERNALERROR;
        break;
    }
    return retval;
}